

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O3

TsStatus_t ts_message_destroy(TsMessageRef_t message)

{
  int iVar1;
  TsStatus_t TVar2;
  int i;
  long lVar3;
  
  TVar2 = TsStatusErrorPreconditionFailed;
  if ((message != (TsMessageRef_t)0x0) && (iVar1 = message->references, 0 < iVar1)) {
    message->references = iVar1 + -1;
    TVar2 = TsStatusOk;
    if (iVar1 == 1) {
      if ((message->type & ~TsTypeFloat) == TsTypeMessage) {
        lVar3 = 0;
        do {
          if (*(TsMessageRef_t *)(message->name + lVar3 * 8 + 0x1c) != (TsMessageRef_t)0x0) {
            ts_message_destroy(*(TsMessageRef_t *)(message->name + lVar3 * 8 + 0x1c));
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xf);
      }
      free(message);
    }
  }
  return TVar2;
}

Assistant:

TsStatus_t ts_message_destroy(TsMessageRef_t message)
{
	/* check preconditions */
	if (message == NULL || message->references <= 0) {
		return TsStatusErrorPreconditionFailed;
	}

	/* simply change its status */
	message->references--;

	/* and destroy along with children */
	if (message->references <= 0) {

		if (message->type == TsTypeArray || message->type == TsTypeMessage) {
			for (int i = 0; i < TS_MESSAGE_MAX_BRANCHES; i++) {
				if (message->value._xfields[i] != NULL) {
					ts_message_destroy(message->value._xfields[i]);
				}
			}
		}
#ifdef TS_MESSAGE_STATIC_MEMORY
		message->references = 0;
		_ts_message_counter--;
		if (_ts_message_counter <= 0) {
			dbg_printf("ts_message_destroy: all messages that had been created are now destroyed\n");
		}
#else
		free(message);
#endif
	}

	/* return ok */
	return TsStatusOk;
}